

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_> *
Jinx::Impl::ReplaceUtf8CharsAtRange
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
           *__return_storage_ptr__,String *dest,String *source,pair<long,_long> *range)

{
  long lVar1;
  long lVar2;
  size_type sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  size_t size;
  size_t i_1;
  size_t rangeCount;
  size_t i;
  size_t charCount;
  char *srcEnd;
  char *srcCurr;
  char *destCurr;
  undefined1 local_68 [8];
  String out;
  char *targetEnd;
  char *targetStart;
  char *destEnd;
  char *destStart;
  pair<long,_long> *range_local;
  String *source_local;
  String *dest_local;
  
  if (range->second < range->first) {
    LogWriteLine(Error,"First range index is greater than second");
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  else {
    srcCurr = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              c_str(dest);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                      (dest);
    pcVar4 = srcCurr + sVar3;
    pcVar5 = GetUtf8CstrByIndex(dest,range->first);
    out.field_2._8_8_ = GetUtf8CstrByIndex(dest,range->second);
    if ((pcVar5 == (char *)0x0) || ((char *)out.field_2._8_8_ == (char *)0x0)) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>::
      optional(__return_storage_ptr__);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
                ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_68);
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                        (dest);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_68,
                 sVar3);
      while (srcCurr < pcVar4) {
        if (srcCurr == pcVar5) {
          srcEnd = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                   ::c_str(source);
          sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                  size(source);
          pcVar6 = srcEnd + sVar3;
          while (srcEnd < pcVar6) {
            sVar7 = GetUtf8CharSize(srcEnd);
            for (rangeCount = 0; rangeCount < sVar7; rangeCount = rangeCount + 1) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              operator+=((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                         local_68,*srcEnd);
              srcEnd = srcEnd + 1;
            }
          }
          lVar1 = range->second;
          lVar2 = range->first;
          for (size = 0; size < (lVar1 - lVar2) + 1U; size = size + 1) {
            sVar7 = GetUtf8CharSize(srcCurr);
            srcCurr = srcCurr + sVar7;
          }
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_68,
                     *srcCurr);
          srcCurr = srcCurr + 1;
        }
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_68);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t std::optional<String> ReplaceUtf8CharsAtRange(const String & dest, const String & source, const std::pair<int64_t, int64_t> & range)
	{
		if (range.first > range.second)
		{
			LogWriteLine(LogLevel::Error, "First range index is greater than second");
			return std::optional<String>();
		}
		const char * destStart = dest.c_str();
		const char * destEnd = destStart + dest.size();
		const char * targetStart = GetUtf8CstrByIndex(dest, range.first);
		const char * targetEnd = GetUtf8CstrByIndex(dest, range.second);
		if (targetStart == nullptr || targetEnd == nullptr)
			return std::optional<String>();
		String out;
		out.reserve(dest.size());
		const char * destCurr = destStart;
		while (destCurr < destEnd)
		{
			if (destCurr == targetStart)
			{
				const char * srcCurr = source.c_str();
				const char * srcEnd = srcCurr + source.size();
				while (srcCurr < srcEnd)
				{
					size_t charCount = GetUtf8CharSize(srcCurr);
					for (size_t i = 0; i < charCount; ++i)
					{
						out += *srcCurr;
						++srcCurr;
					}
				}
				size_t rangeCount = range.second - range.first + 1;
				for (size_t i = 0; i < rangeCount; ++i)
				{
					size_t size = GetUtf8CharSize(destCurr);
					destCurr += size;
				}
			}
			else
			{
				out += *destCurr;
				++destCurr;
			}
		}
		return out;
	}